

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

void separate_host(char *lfname,char *host)

{
  char *pcVar1;
  long local_28;
  ptrdiff_t diff;
  char *cp;
  char *host_local;
  char *lfname_local;
  
  diff = (ptrdiff_t)(lfname + 1);
  cp = host;
  while (*(char *)diff != '}') {
    *cp = *(char *)diff;
    diff = diff + 1;
    cp = cp + 1;
  }
  *cp = '\0';
  pcVar1 = (char *)(diff + 1);
  if (*(char *)(diff + 2) == '\0') {
    *lfname = '<';
    lfname[1] = '\0';
  }
  else {
    local_28 = (long)pcVar1 - (long)lfname;
    if ((*pcVar1 == '<') || (*pcVar1 == '/')) {
      local_28 = local_28 + 1;
      pcVar1 = (char *)(diff + 2);
    }
    while (diff = (ptrdiff_t)pcVar1, *(char *)diff != '\0') {
      *(undefined1 *)(diff - local_28) = *(undefined1 *)diff;
      pcVar1 = (char *)(diff + 1);
    }
    if ((*(char *)(diff + -1) == '>') && (*(char *)(diff + -2) != '\'')) {
      *(undefined1 *)((diff + -1) - local_28) = 0;
    }
    else {
      *(undefined1 *)(diff - local_28) = 0;
    }
  }
  return;
}

Assistant:

void separate_host(char *lfname, char *host)
#endif /* DOS */
{
  char *cp;
  ptrdiff_t diff;

  cp = lfname + 1; /* Skip the initial "{". */

  while (*cp != '}') *host++ = *cp++;
  *host = '\0';

  cp++; /* Now, *cp == '<' or drive letter. */
#ifdef DOS
  /* Check if there's a drive specified. */

  if (*(cp + 1) == DRIVESEP) {
    *drive = *cp; /* copy the drive letter, if there is one */
    cp++;
    cp++; /* Move to the real `<`/ */
  } else
    *drive = '\0'; /* no drive */
#endif             /* DOS */

  if (*(cp + 1) == '\0') {
    /* Root directory is specified. */
    *lfname = '<';
    *(lfname + 1) = '\0';
  } else {
    diff = cp - lfname;
    if (*cp == '<' || *cp == DIRSEP
#ifdef DOS
        || *cp == UNIXDIRSEP
#endif /* DOS */
        ) {
      /*
       * Skip the initial directory delimiter.
       */
      cp++;
      diff++;
    }
    while (*cp) {
      *(cp - diff) = *cp;
      cp++;
    }
    if (*(cp - 1) == '>' && *(cp - 2) != '\'') {
      /*
       * The last character is a not quoted directory
       * delimiter.  We have to remove it from the result
       * lfname for the convenience of unixpathname.
       */
      *(cp - diff - 1) = '\0';
    } else {
      *(cp - diff) = '\0';
    }
  }
}